

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupPerm(Gia_Man_t *p,Vec_Int_t *vPiPerm)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  Gia_Obj_t *pGVar6;
  uint uVar7;
  int iVar8;
  Gia_Man_t *p_00;
  size_t sVar9;
  char *pcVar10;
  Vec_Int_t *pVVar11;
  Gia_Obj_t *pGVar12;
  Gia_Obj_t *pGVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  
  if (vPiPerm->nSize != p->vCis->nSize - p->nRegs) {
    __assert_fail("Vec_IntSize(vPiPerm) == Gia_ManPiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x33f,"Gia_Man_t *Gia_ManDupPerm(Gia_Man_t *, Vec_Int_t *)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar4 = p->pName;
  if (pcVar4 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar4);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar4);
  }
  p_00->pName = pcVar10;
  pcVar4 = p->pSpec;
  if (pcVar4 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar4);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar4);
  }
  p_00->pSpec = pcVar10;
  p->pObjs->Value = 0;
  iVar8 = p->nRegs;
  pVVar11 = p->vCis;
  iVar14 = pVVar11->nSize;
  if (iVar8 < iVar14) {
    lVar16 = 0;
    do {
      if (iVar14 <= lVar16) goto LAB_001dae7b;
      if ((pVVar11->pArray[lVar16] < 0) || (p->nObjs <= pVVar11->pArray[lVar16])) {
LAB_001dae5c:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar12 = Gia_ManAppendObj(p_00);
      uVar5 = *(ulong *)pGVar12;
      *(ulong *)pGVar12 = uVar5 | 0x9fffffff;
      *(ulong *)pGVar12 =
           uVar5 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar6 = p_00->pObjs;
      if ((pGVar12 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar12)) goto LAB_001dae3d;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar6) >> 2) * -0x55555555);
      pGVar6 = p_00->pObjs;
      if ((pGVar12 < pGVar6) || (pGVar6 + p_00->nObjs <= pGVar12)) goto LAB_001dae3d;
      if (vPiPerm->nSize <= lVar16) {
LAB_001dae7b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar1 = vPiPerm->pArray[lVar16];
      iVar8 = p->nRegs;
      pVVar11 = p->vCis;
      iVar14 = pVVar11->nSize;
      if (iVar14 - iVar8 <= (int)uVar1) {
        __assert_fail("v < Gia_ManPiNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
      }
      if (((int)uVar1 < 0) || (iVar14 <= (int)uVar1)) goto LAB_001dae7b;
      iVar2 = pVVar11->pArray[uVar1];
      if (((long)iVar2 < 0) || (iVar15 = p->nObjs, iVar15 <= iVar2)) goto LAB_001dae5c;
      p->pObjs[iVar2].Value = (int)((ulong)((long)pGVar12 - (long)pGVar6) >> 2) * 0x55555556;
      lVar16 = lVar16 + 1;
    } while (lVar16 < iVar14 - iVar8);
  }
  else {
    iVar15 = p->nObjs;
  }
  if (1 < iVar15) {
    lVar17 = 1;
    lVar16 = 0x14;
    do {
      pGVar6 = p->pObjs;
      uVar5 = *(ulong *)((long)pGVar6 + lVar16 + -8);
      uVar7 = (uint)uVar5;
      iVar8 = (int)(uVar5 & 0x1fffffff);
      uVar1 = (uint)(uVar5 >> 0x20);
      if ((uVar5 & 0x1fffffff) == 0x1fffffff || (int)uVar7 < 0) {
        if ((uVar7 & 0x9fffffff) == 0x9fffffff) {
          if (p->vCis->nSize - p->nRegs <= (int)(uVar1 & 0x1fffffff)) {
            pGVar13 = Gia_ManAppendObj(p_00);
            uVar5 = *(ulong *)pGVar13;
            *(ulong *)pGVar13 = uVar5 | 0x9fffffff;
            *(ulong *)pGVar13 =
                 uVar5 & 0xe0000000ffffffff | 0x9fffffff |
                 (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
            pGVar12 = p_00->pObjs;
            if ((pGVar12 <= pGVar13) && (pGVar13 < pGVar12 + p_00->nObjs)) {
              Vec_IntPush(p_00->vCis,
                          (int)((ulong)((long)pGVar13 - (long)pGVar12) >> 2) * -0x55555555);
              pGVar12 = p_00->pObjs;
              if ((pGVar12 <= pGVar13) && (pGVar13 < pGVar12 + p_00->nObjs)) {
                iVar8 = (int)((ulong)((long)pGVar13 - (long)pGVar12) >> 2) * 0x55555556;
                goto LAB_001dae08;
              }
            }
LAB_001dae3d:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
        }
        else if ((int)uVar7 < 0 && iVar8 != 0x1fffffff) {
          uVar1 = *(uint *)((long)pGVar6 + lVar16 + (ulong)(uint)(iVar8 << 2) * -3);
          if ((int)uVar1 < 0) goto LAB_001dae9a;
          iVar8 = Gia_ManAppendCo(p_00,uVar1 ^ uVar7 >> 0x1d & 1);
          goto LAB_001dae08;
        }
      }
      else {
        uVar7 = *(uint *)((long)pGVar6 + lVar16 + (ulong)(uint)(iVar8 << 2) * -3);
        if (((int)uVar7 < 0) ||
           (uVar3 = *(uint *)((long)pGVar6 +
                             lVar16 + (ulong)((uint)(uVar5 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar3 < 0)) {
LAB_001dae9a:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        iVar8 = Gia_ManAppendAnd(p_00,uVar7 ^ (uint)(uVar5 >> 0x1d) & 1,uVar3 ^ uVar1 >> 0x1d & 1);
LAB_001dae08:
        *(int *)(&pGVar6->field_0x0 + lVar16) = iVar8;
      }
      lVar17 = lVar17 + 1;
      lVar16 = lVar16 + 0xc;
    } while (lVar17 < p->nObjs);
    iVar8 = p->nRegs;
  }
  Gia_ManSetRegNum(p_00,iVar8);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupPerm( Gia_Man_t * p, Vec_Int_t * vPiPerm )
{
//    Vec_Int_t * vPiPermInv;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( Vec_IntSize(vPiPerm) == Gia_ManPiNum(p) );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
//    vPiPermInv = Vec_IntInvert( vPiPerm, -1 );
    Gia_ManForEachPi( p, pObj, i )
//        Gia_ManPi(p, Vec_IntEntry(vPiPermInv,i))->Value = Gia_ManAppendCi( pNew );
        Gia_ManPi(p, Vec_IntEntry(vPiPerm,i))->Value = Gia_ManAppendCi( pNew );
//    Vec_IntFree( vPiPermInv );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
        {
            if ( Gia_ObjIsRo(p, pObj) )
                pObj->Value = Gia_ManAppendCi( pNew );
        }
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}